

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::CanDeadStoreInstrForScopeObjRemoval(BackwardPass *this,Sym *sym)

{
  OpCode OVar1;
  Func *this_00;
  bool bVar2;
  JITTimeFunctionBody *this_01;
  Opnd *pOVar3;
  HelperCallOpnd *pHVar4;
  StackSym *this_02;
  Instr *this_03;
  RegOpnd *this_04;
  bool local_44;
  bool local_43;
  RegOpnd *scopeObjOpnd;
  bool doScopeObjCreation;
  Func *currFunc;
  Sym *sym_local;
  BackwardPass *this_local;
  
  if ((this->tag == DeadStorePhase) &&
     (bVar2 = Func::IsStackArgsEnabled(this->currentInstr->m_func), bVar2)) {
    this_00 = this->currentInstr->m_func;
    this_01 = Func::GetJITFunctionBody(this_00);
    bVar2 = JITTimeFunctionBody::GetDoScopeObjectCreation(this_01);
    OVar1 = this->currentInstr->m_opcode;
    if (OVar1 == LdSlot) {
      if ((sym != (Sym *)0x0) && (bVar2 = IsFormalParamSym(this,this_00,sym), bVar2)) {
        return true;
      }
    }
    else {
      if ((ushort)(OVar1 - GetCachedFunc) < 2) {
        local_43 = false;
        if (!bVar2) {
          pOVar3 = IR::Instr::GetSrc1(this->currentInstr);
          local_43 = IR::Opnd::IsScopeObjOpnd(pOVar3,this_00);
        }
        return local_43;
      }
      if (OVar1 == InitCachedScope) {
        if (!bVar2) {
          pOVar3 = IR::Instr::GetDst(this->currentInstr);
          bVar2 = IR::Opnd::IsScopeObjOpnd(pOVar3,this_00);
          if (bVar2) {
            return true;
          }
        }
      }
      else if (OVar1 == CallHelper) {
        if (!bVar2) {
          pOVar3 = IR::Instr::GetSrc1(this->currentInstr);
          pHVar4 = IR::Opnd::AsHelperCallOpnd(pOVar3);
          if (pHVar4->m_fnHelper == HelperOP_InitCachedFuncs) {
            pOVar3 = IR::Instr::GetSrc2(this->currentInstr);
            this_02 = IR::Opnd::GetStackSym(pOVar3);
            this_03 = StackSym::GetInstrDef(this_02);
            pOVar3 = IR::Instr::GetSrc1(this_03);
            this_04 = IR::Opnd::AsRegOpnd(pOVar3);
            bVar2 = IR::Opnd::IsScopeObjOpnd(&this_04->super_Opnd,this_00);
            return bVar2;
          }
        }
      }
      else if ((ushort)(OVar1 - BrFncCachedScopeEq) < 2) {
        local_44 = false;
        if (!bVar2) {
          pOVar3 = IR::Instr::GetSrc2(this->currentInstr);
          local_44 = IR::Opnd::IsScopeObjOpnd(pOVar3,this_00);
        }
        return local_44;
      }
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::CanDeadStoreInstrForScopeObjRemoval(Sym *sym) const
{
    if (tag == Js::DeadStorePhase && this->currentInstr->m_func->IsStackArgsEnabled())
    {
        Func * currFunc = this->currentInstr->m_func;
        bool doScopeObjCreation = currFunc->GetJITFunctionBody()->GetDoScopeObjectCreation();
        switch (this->currentInstr->m_opcode)
        {
            case Js::OpCode::InitCachedScope:
            {
                if(!doScopeObjCreation && this->currentInstr->GetDst()->IsScopeObjOpnd(currFunc))
                {
                    /*
                    *   We don't really dead store this instruction. We just want the source sym of this instruction
                    *   to NOT be tracked as USED by this instruction.
                    *   This instr will effectively be lowered to dest = MOV NULLObject, in the lowerer phase.
                    */
                    return true;
                }
                break;
            }
            case Js::OpCode::LdSlot:
            {
                if (sym && IsFormalParamSym(currFunc, sym))
                {
                    return true;
                }
                break;
            }
            case Js::OpCode::CommitScope:
            case Js::OpCode::GetCachedFunc:
            {
                return !doScopeObjCreation && this->currentInstr->GetSrc1()->IsScopeObjOpnd(currFunc);
            }
            case Js::OpCode::BrFncCachedScopeEq:
            case Js::OpCode::BrFncCachedScopeNeq:
            {
                return !doScopeObjCreation && this->currentInstr->GetSrc2()->IsScopeObjOpnd(currFunc);
            }
            case Js::OpCode::CallHelper:
            {
                if (!doScopeObjCreation && this->currentInstr->GetSrc1()->AsHelperCallOpnd()->m_fnHelper == IR::JnHelperMethod::HelperOP_InitCachedFuncs)
                {
                    IR::RegOpnd * scopeObjOpnd = this->currentInstr->GetSrc2()->GetStackSym()->GetInstrDef()->GetSrc1()->AsRegOpnd();
                    return scopeObjOpnd->IsScopeObjOpnd(currFunc);
                }
                break;
            }
        }
    }
    return false;
}